

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

void outputClausesToLaTeX(Problem *prb)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  ostream *latexOut_00;
  Unit *u;
  undefined8 *puVar5;
  Problem *this;
  CompositeISE *this_00;
  Clause *cl;
  ClauseIterator cit;
  uint index;
  CompositeISE simplifier;
  ofstream latexOut;
  LaTeX latex;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  CompositeISE *in_stack_fffffffffffffcd0;
  Clause *in_stack_fffffffffffffce0;
  LaTeX *in_stack_fffffffffffffcf8;
  string local_2b8 [32];
  Clause *local_298;
  int local_284;
  string local_260 [48];
  string local_230 [32];
  ostream local_210 [519];
  LaTeX local_9 [9];
  
  Shell::LaTeX::LaTeX(local_9);
  Shell::Options::latexOutput_abi_cxx11_
            ((Options *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,pcVar2,_S_out);
  std::__cxx11::string::~string(local_230);
  Shell::LaTeX::header_abi_cxx11_(in_stack_fffffffffffffcf8);
  poVar3 = std::operator<<(local_210,local_260);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_260);
  poVar3 = std::operator<<(local_210,"\\section{Problem ");
  psVar4 = Shell::Options::problemName_abi_cxx11_(Lib::env);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  latexOut_00 = std::operator<<(poVar3,"}");
  std::ostream::operator<<(latexOut_00,std::endl<char,std::char_traits<char>>);
  u = (Unit *)std::operator<<(local_210,"\\[\n\\begin{array}{ll}");
  std::ostream::operator<<(u,std::endl<char,std::char_traits<char>>);
  Inferences::CompositeISE::CompositeISE(in_stack_fffffffffffffcd0);
  puVar5 = (undefined8 *)operator_new(0x10);
  *puVar5 = 0;
  puVar5[1] = 0;
  Inferences::TrivialInequalitiesRemovalISE::TrivialInequalitiesRemovalISE
            ((TrivialInequalitiesRemovalISE *)in_stack_fffffffffffffcd0);
  Inferences::CompositeISE::addFront
            (in_stack_fffffffffffffcd0,
             (ImmediateSimplificationEngine *)
             CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
  operator_new(0x18);
  Inferences::TautologyDeletionISE::TautologyDeletionISE
            ((TautologyDeletionISE *)in_stack_fffffffffffffcd0,(bool)in_stack_fffffffffffffccf);
  Inferences::CompositeISE::addFront
            (in_stack_fffffffffffffcd0,
             (ImmediateSimplificationEngine *)
             CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
  this = (Problem *)operator_new(0x10);
  this->_units = (UnitList *)0x0;
  (this->_deletedFunctions)._timestamp = 0;
  (this->_deletedFunctions)._size = 0;
  Inferences::DuplicateLiteralRemovalISE::DuplicateLiteralRemovalISE
            ((DuplicateLiteralRemovalISE *)in_stack_fffffffffffffcd0);
  Inferences::CompositeISE::addFront
            (in_stack_fffffffffffffcd0,
             (ImmediateSimplificationEngine *)
             CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
  local_284 = 0;
  Kernel::Problem::clauseIterator(this);
  while (bVar1 = Lib::VirtualIterator<Kernel::Clause_*>::hasNext
                           ((VirtualIterator<Kernel::Clause_*> *)0x183e6d), bVar1) {
    local_298 = Lib::VirtualIterator<Kernel::Clause_*>::next
                          ((VirtualIterator<Kernel::Clause_*> *)0x183e8d);
    in_stack_fffffffffffffce0 =
         Inferences::CompositeISE::simplify((CompositeISE *)local_298,in_stack_fffffffffffffce0);
    local_298 = in_stack_fffffffffffffce0;
    if (in_stack_fffffffffffffce0 != (Clause *)0x0) {
      local_284 = local_284 + 1;
      outputUnitToLaTeX((LaTeX *)poVar3,(ofstream *)latexOut_00,u,(uint)((ulong)puVar5 >> 0x20));
    }
  }
  poVar3 = std::operator<<(local_210,"\\end{array}\n\\]");
  Shell::LaTeX::footer_abi_cxx11_((LaTeX *)this);
  this_00 = (CompositeISE *)std::operator<<(poVar3,local_2b8);
  std::operator<<((ostream *)this_00,"\n");
  std::__cxx11::string::~string(local_2b8);
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
            ((VirtualIterator<Kernel::Clause_*> *)this_00);
  Inferences::CompositeISE::~CompositeISE(this_00);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void outputClausesToLaTeX(Problem* prb)
{
  ASS(env.options->latexOutput()!="off");

  LaTeX latex;
  ofstream latexOut(env.options->latexOutput().c_str());
  latexOut << latex.header() << endl;
  latexOut << "\\section{Problem "<<env.options->problemName() << "}" << endl;
  //TODO output more header
  latexOut << "\\[\n\\begin{array}{ll}" << endl;

  CompositeISE simplifier;
  simplifier.addFront(new TrivialInequalitiesRemovalISE());
  simplifier.addFront(new TautologyDeletionISE());
  simplifier.addFront(new DuplicateLiteralRemovalISE());

  unsigned index=0;
  ClauseIterator cit = prb->clauseIterator();
  while (cit.hasNext()) {
    Clause* cl = cit.next();
    cl = simplifier.simplify(cl);
    if (!cl) {
      continue;
    }
    outputUnitToLaTeX(latex,latexOut,cl,index++);
  }
  latexOut  << "\\end{array}\n\\]" << latex.footer() << "\n";

  //close ofstream?
}